

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::integrators::Integrator::setDynamicalSystem
          (Integrator *this,shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> *dynamicalSystem)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> *in_RSI;
  shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> *in_RDI;
  bool local_1;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 1));
  if (bVar1) {
    IntegratorInfo::name_abi_cxx11_((IntegratorInfo *)0x2f52c9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError(pcVar3,"setDynamicalSystem","Change dynamical system is forbidden.");
    local_1 = false;
  }
  else {
    std::shared_ptr<iDynTree::optimalcontrol::DynamicalSystem>::operator=(in_RDI,in_RSI);
    bVar2 = (**(code **)&(in_RDI->
                         super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr[1].field_0x20)();
    local_1 = (bool)(bVar2 & 1);
  }
  return local_1;
}

Assistant:

bool Integrator::setDynamicalSystem(const std::shared_ptr<DynamicalSystem> dynamicalSystem)
            {
                if (m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "setDynamicalSystem", "Change dynamical system is forbidden."); //I want to prevent the change of dynamical system between two iterations of an eventual optimal control problem. This change would not be detected and would cause problems of dimensions.
                    return false;
                }

                m_dynamicalSystem_ptr = dynamicalSystem;

                return allocateBuffers();
            }